

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::Shader::Shader(Shader *this)

{
  Shader *this_local;
  
  Item::Item(&this->super_Item,TYPE_SHADER);
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Shader_00144a38;
  *(undefined4 *)&(this->super_Item).field_0xc = 6;
  this->compileStatus = false;
  ShaderSource::ShaderSource(&this->source);
  InfoLog::InfoLog(&this->infoLog);
  return;
}

Assistant:

Shader				(void) : Item(TYPE_SHADER), shaderType(SHADERTYPE_LAST), compileStatus(false) {}